

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeQueue.h
# Opt level: O0

int __thiscall ThreadSafeQueue<int>::pop(ThreadSafeQueue<int> *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  type item;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ThreadSafeQueue<int> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_mutex);
  while( true ) {
    bVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->m_queue);
    if (!bVar2) break;
    std::condition_variable::wait((unique_lock *)&this->m_cv);
  }
  pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_queue);
  iVar1 = *pvVar3;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_queue);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return iVar1;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(m_mutex);
		while (m_queue.empty())
		{
			m_cv.wait(lock);
		}

		auto item = std::move(m_queue.front());
		m_queue.pop();
		return item;
	}